

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O3

int __thiscall pg::FPISolver::updateBlock(FPISolver *this,int i,int n)

{
  uint uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  Game *pGVar5;
  int *piVar6;
  int iVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  int to;
  int iVar11;
  uint *puVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  _label_vertex local_40;
  
  if (n == 0) {
    return 0;
  }
  uVar17 = (ulong)i;
  iVar7 = 0;
LAB_0015914a:
  uVar10 = uVar17 >> 6;
  puVar2 = ((this->super_Solver).disabled)->_bits;
  if (((puVar2[uVar10] >> (uVar17 & 0x3f) & 1) == 0) && (this->frozen[uVar17] == 0)) {
    puVar3 = (this->distraction)._bits;
    uVar9 = 1L << (uVar17 & 0x3f);
    uVar4 = puVar3[uVar10];
    if ((uVar4 & uVar9) != 0) goto LAB_00159339;
    pGVar5 = (this->super_Solver).game;
    piVar6 = pGVar5->_outedges;
    lVar13 = (long)pGVar5->_firstouts[uVar17];
    uVar1 = piVar6[lVar13];
    uVar16 = (ulong)uVar1;
    if (((pGVar5->_owner)._bits[uVar10] & uVar9) == 0) {
      uVar15 = 1;
      if (uVar1 != 0xffffffff) {
        puVar12 = (uint *)(piVar6 + lVar13 + 1);
        do {
          iVar11 = (int)uVar16;
          uVar14 = (ulong)(long)iVar11 >> 6;
          if (((puVar2[uVar14] >> (uVar16 & 0x3f) & 1) == 0) &&
             (uVar16 = 1L << (uVar16 & 0x3f),
             (((this->parity)._bits[uVar14] & uVar16) != 0) == ((puVar3[uVar14] & uVar16) != 0))) {
            uVar15 = 0;
            goto LAB_0015926d;
          }
          uVar1 = *puVar12;
          uVar16 = (ulong)uVar1;
          puVar12 = puVar12 + 1;
        } while (uVar1 != 0xffffffff);
        uVar15 = 1;
      }
    }
    else {
      uVar15 = 0;
      if (uVar1 != 0xffffffff) {
        puVar12 = (uint *)(piVar6 + lVar13 + 1);
LAB_001591c4:
        iVar11 = (int)uVar16;
        uVar14 = (ulong)(long)iVar11 >> 6;
        if (((puVar2[uVar14] >> (uVar16 & 0x3f) & 1) != 0) ||
           (uVar16 = 1L << (uVar16 & 0x3f),
           ((puVar3[uVar14] & uVar16) != 0) == (((this->parity)._bits[uVar14] & uVar16) != 0)))
        goto LAB_001591f5;
        uVar15 = 1;
LAB_0015926d:
        this->strategy[uVar17] = iVar11;
      }
    }
    goto LAB_00159275;
  }
  goto LAB_00159339;
LAB_001591f5:
  uVar1 = *puVar12;
  uVar16 = (ulong)uVar1;
  puVar12 = puVar12 + 1;
  if (uVar1 == 0xffffffff) goto code_r0x00159202;
  goto LAB_001591c4;
code_r0x00159202:
  uVar15 = 0;
LAB_00159275:
  if (uVar15 != (((this->parity)._bits[uVar10] & uVar9) != 0)) {
    iVar7 = iVar7 + 1;
    puVar3[uVar10] = uVar4 | uVar9;
    if (1 < (this->super_Solver).trace) {
      poVar8 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vertex ",7);
      local_40.g = (this->super_Solver).game;
      local_40.v = (int)uVar17;
      poVar8 = operator<<(poVar8,&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," is now a distraction (won by ",0x1e);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
  }
LAB_00159339:
  uVar17 = uVar17 + 1;
  n = n + -1;
  if (n == 0) {
    return iVar7;
  }
  goto LAB_0015914a;
}

Assistant:

int
FPISolver::updateBlock(int i, int n)
{
    int res = 0;
    for (; n != 0; i++, n--) {
        if (disabled[i]) continue;
        if (frozen[i]) continue;
        if (distraction[i]) continue;

        // update whether current vertex <i> is a distraction by computing the one step winner
        int onestep_winner;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    strategy[i] = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    strategy[i] = to;
                    break;
                }
            }
        }
        if (parity[i] != onestep_winner) {
            distraction[i] = true;
            res++;
#ifndef NDEBUG
            if (trace >= 2) logger << "vertex " << label_vertex(i) << " is now a distraction (won by " << onestep_winner << ")" << std::endl;
#endif
        }
    }
    return res;
}